

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool set_nearby_voice_dir_path(OpenJTalk *oj,char *path)

{
  byte bVar1;
  _Bool _Var2;
  void *pvVar3;
  int iVar4;
  char *wildcard;
  char **ppcVar5;
  bool bVar6;
  char temp [260];
  char parent [260];
  char acStack_248 [272];
  char local_138 [264];
  
  if (path == (char *)0x0 || oj == (OpenJTalk *)0x0) {
    bVar1 = 0;
    goto LAB_0013fe70;
  }
  if (*path != '\0') {
    pvVar3 = memset(acStack_248,0,0x104);
    bVar1 = (byte)pvVar3;
    iVar4 = 2;
    if (G_DEFAULT_VOICE_DIR_NAMES[0] != (char *)0x0) {
      ppcVar5 = G_DEFAULT_VOICE_DIR_NAMES;
      wildcard = G_DEFAULT_VOICE_DIR_NAMES[0];
      do {
        ppcVar5 = ppcVar5 + 1;
        bVar1 = search_directory_or_file(path,wildcard,true,acStack_248);
        if ((bool)bVar1) {
          iVar4 = 5;
          break;
        }
        wildcard = *ppcVar5;
      } while (wildcard != (char *)0x0);
    }
    if (iVar4 == 5) {
LAB_0013fe4b:
      strcpy(oj->dn_voice_dir_path,acStack_248);
      bVar1 = 1;
      goto LAB_0013fe70;
    }
    if (iVar4 != 2) goto LAB_0013fe70;
    get_dir(path,local_138);
    if ((local_138[0] != '\0') && (bVar6 = G_DEFAULT_VOICE_DIR_NAMES[0] == (char *)0x0, !bVar6)) {
      _Var2 = search_directory_or_file(local_138,G_DEFAULT_VOICE_DIR_NAMES[0],true,acStack_248);
      if (!_Var2) {
        ppcVar5 = G_DEFAULT_VOICE_DIR_NAMES;
        do {
          ppcVar5 = ppcVar5 + 1;
          bVar6 = *ppcVar5 == (char *)0x0;
          if (bVar6) goto LAB_0013fe47;
          _Var2 = search_directory_or_file(local_138,*ppcVar5,true,acStack_248);
        } while (!_Var2);
      }
      if (!bVar6) goto LAB_0013fe4b;
    }
  }
LAB_0013fe47:
  bVar1 = 0;
LAB_0013fe70:
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool set_nearby_voice_dir_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 指定位置から可能性のあるフォルダを探す
	for (const char **d = G_DEFAULT_VOICE_DIR_NAMES; *d != NULL; d++)
	{
		if (search_directory(path, *d, temp))
		{
			goto return_true;
		}
	}

	// その親ディレクトリから可能性のあるフォルダを探す
	char parent[MAX_PATH];
	get_dir_path(path, parent);
	if (parent != NULL && strlen(parent) != 0)
	{
		for (const char **d = G_DEFAULT_VOICE_DIR_NAMES; *d != NULL; d++)
		{
			if (search_directory(parent, *d, temp))
			{
				goto return_true;
			}
		}
	}
	return false;

return_true:
	strcpy(oj->dn_voice_dir_path, temp);
	return true;
}